

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_req.cc
# Opt level: O0

int X509_REQ_add_extensions_nid(X509_REQ *req,stack_st_X509_EXTENSION *exts,int nid)

{
  int iVar1;
  int ret;
  int ext_len;
  uchar *ext;
  stack_st_X509_EXTENSION *psStack_20;
  int nid_local;
  stack_st_X509_EXTENSION *exts_local;
  X509_REQ *req_local;
  
  _ret = (uchar *)0x0;
  ext._4_4_ = nid;
  psStack_20 = exts;
  exts_local = (stack_st_X509_EXTENSION *)req;
  iVar1 = ASN1_item_i2d((ASN1_VALUE *)exts,(uchar **)&ret,(ASN1_ITEM *)&X509_EXTENSIONS_it);
  if (iVar1 < 1) {
    req_local._4_4_ = 0;
  }
  else {
    iVar1 = X509_REQ_add1_attr_by_NID((X509_REQ *)exts_local,ext._4_4_,0x10,_ret,iVar1);
    OPENSSL_free(_ret);
    req_local._4_4_ = iVar1;
  }
  return req_local._4_4_;
}

Assistant:

int X509_REQ_add_extensions_nid(X509_REQ *req,
                                const STACK_OF(X509_EXTENSION) *exts, int nid) {
  // Generate encoding of extensions
  unsigned char *ext = NULL;
  int ext_len =
      ASN1_item_i2d((ASN1_VALUE *)exts, &ext, ASN1_ITEM_rptr(X509_EXTENSIONS));
  if (ext_len <= 0) {
    return 0;
  }
  int ret = X509_REQ_add1_attr_by_NID(req, nid, V_ASN1_SEQUENCE, ext, ext_len);
  OPENSSL_free(ext);
  return ret;
}